

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpcodeInfo.cpp
# Opt level: O1

OpcodeInfo * __thiscall OpcodeInfo::dst(OpcodeInfo *this,FieldType field,DecodeType decode)

{
  DecodeStep local_14;
  
  local_14.is_src = false;
  local_14.field = field;
  local_14.decode = decode;
  step(this,&local_14);
  return this;
}

Assistant:

OpcodeInfo& OpcodeInfo::dst(FieldType field, DecodeType decode) {
  DecodeStep new_step;
  new_step.is_src = false;
  new_step.field = field;
  new_step.decode = decode;
  step(new_step);
  return *this;
}